

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void FindActions(lemon *lemp)

{
  e_action eVar1;
  int iVar2;
  int iVar3;
  e_assoc eVar4;
  symbol *psVar5;
  symbol *psVar6;
  state **ppsVar7;
  symbol *psVar8;
  action *paVar9;
  action *paVar10;
  rule *prVar11;
  uint uVar12;
  ulong uVar13;
  action *paVar14;
  state *psVar15;
  int iVar16;
  config *pcVar17;
  long lVar18;
  long lVar19;
  
  if (0 < lemp->nstate) {
    lVar19 = 0;
    do {
      psVar15 = lemp->sorted[lVar19];
      pcVar17 = psVar15->cfp;
      if (pcVar17 != (config *)0x0) {
        do {
          if ((pcVar17->rp->nrhs == pcVar17->dot) && (0 < lemp->nterminal)) {
            lVar18 = 0;
            do {
              if (pcVar17->fws[lVar18] != '\0') {
                Action_add(&psVar15->ap,REDUCE,lemp->symbols[lVar18],(char *)pcVar17->rp);
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < lemp->nterminal);
          }
          pcVar17 = pcVar17->next;
        } while (pcVar17 != (config *)0x0);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < lemp->nstate);
  }
  if ((lemp->start == (char *)0x0) || (psVar8 = Symbol_find(lemp->start), psVar8 == (symbol *)0x0))
  {
    psVar8 = lemp->rule->lhs;
  }
  Action_add(&(*lemp->sorted)->ap,ACCEPT,psVar8,(char *)0x0);
  uVar12 = lemp->nstate;
  if (0 < (int)uVar12) {
    lVar19 = 0;
    do {
      psVar15 = lemp->sorted[lVar19];
      paVar9 = psVar15->ap;
      paVar9 = (action *)msort((char *)paVar9,(char **)&paVar9->next,actioncmp);
      psVar15->ap = paVar9;
      if (paVar9 != (action *)0x0) {
LAB_00104e4a:
        paVar10 = paVar9;
        paVar9 = paVar10->next;
        if (paVar9 != (action *)0x0) {
          psVar8 = paVar10->sp;
          paVar14 = paVar9;
          do {
            if (paVar14->sp != psVar8) break;
            iVar16 = 0;
            if ((paVar10->type == SHIFT) && (paVar14->type == SHIFT)) {
              paVar14->type = SSCONFLICT;
              iVar16 = 1;
            }
            eVar1 = paVar10->type;
            if (eVar1 == REDUCE) {
              if (paVar14->type != REDUCE) goto LAB_00104f3d;
              psVar5 = ((paVar10->x).rp)->precsym;
              if ((((psVar5 == (symbol *)0x0) ||
                   (psVar6 = ((paVar14->x).rp)->precsym, psVar6 == (symbol *)0x0)) ||
                  (iVar2 = psVar5->prec, iVar2 < 0)) ||
                 ((iVar3 = psVar6->prec, iVar3 < 0 || (iVar2 == iVar3)))) {
                paVar14->type = RRCONFLICT;
                goto LAB_00104f6a;
              }
              if (iVar3 < iVar2) goto LAB_00104f34;
              if (iVar2 < iVar3) {
                paVar10->type = RD_RESOLVED;
              }
            }
            else if ((eVar1 == SHIFT) && (paVar14->type == REDUCE)) {
              psVar5 = ((paVar14->x).rp)->precsym;
              if (((psVar5 == (symbol *)0x0) || (iVar2 = psVar8->prec, iVar2 < 0)) ||
                 (iVar3 = psVar5->prec, iVar3 < 0)) {
LAB_00104f63:
                paVar14->type = SRCONFLICT;
LAB_00104f6a:
                iVar16 = iVar16 + 1;
              }
              else if (iVar3 < iVar2) {
LAB_00104f34:
                paVar14->type = RD_RESOLVED;
              }
              else {
                if (iVar3 <= iVar2) {
                  if (iVar2 != iVar3) {
LAB_00105050:
                    __assert_fail("spx->prec==spy->prec && spx->assoc==NONE",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                                  ,0x457,
                                  "int resolve_conflict(struct action *, struct action *, struct symbol *)"
                                 );
                  }
                  eVar4 = psVar8->assoc;
                  if (eVar4 != LEFT) {
                    if (eVar4 == NONE) goto LAB_00104f63;
                    if (eVar4 != RIGHT) goto LAB_00105050;
                    goto LAB_00104f34;
                  }
                }
                paVar10->type = SH_RESOLVED;
              }
            }
            else {
LAB_00104f3d:
              if ((4 < eVar1 - SSCONFLICT) && (4 < paVar14->type - SSCONFLICT)) {
                __assert_fail("apx->type==SH_RESOLVED || apx->type==RD_RESOLVED || apx->type==SSCONFLICT || apx->type==SRCONFLICT || apx->type==RRCONFLICT || apy->type==SH_RESOLVED || apy->type==RD_RESOLVED || apy->type==SSCONFLICT || apy->type==SRCONFLICT || apy->type==RRCONFLICT"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                              ,0x473,
                              "int resolve_conflict(struct action *, struct action *, struct symbol *)"
                             );
              }
            }
            lemp->nconflict = lemp->nconflict + iVar16;
            paVar14 = paVar14->next;
          } while (paVar14 != (action *)0x0);
          goto LAB_00104e4a;
        }
      }
      lVar19 = lVar19 + 1;
      uVar12 = lemp->nstate;
    } while (lVar19 < (int)uVar12);
  }
  for (prVar11 = lemp->rule; prVar11 != (rule *)0x0; prVar11 = prVar11->next) {
    prVar11->canReduce = LEMON_FALSE;
  }
  if (0 < (int)uVar12) {
    ppsVar7 = lemp->sorted;
    uVar13 = 0;
    do {
      psVar15 = ppsVar7[uVar13];
      while (psVar15 = (state *)psVar15->ap, psVar15 != (state *)0x0) {
        if (*(e_action *)&psVar15->cfp == REDUCE) {
          ((anon_union_8_2_743af1f4_for_x *)&psVar15->statenum)->rp->canReduce = LEMON_TRUE;
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar12);
  }
  for (prVar11 = lemp->rule; prVar11 != (rule *)0x0; prVar11 = prVar11->next) {
    if (prVar11->canReduce == LEMON_FALSE) {
      FindActions_cold_1();
    }
  }
  return;
}

Assistant:

void FindActions(struct lemon *lemp)
{
  int i,j;
  struct config *cfp;
  struct state *stp;
  struct symbol *sp;
  struct rule *rp;

  /* Add all of the reduce actions 
  ** A reduce action is added for each element of the followset of
  ** a configuration which has its dot at the extreme right.
  */
  for(i=0; i<lemp->nstate; i++){   /* Loop over all states */
    stp = lemp->sorted[i];
    for(cfp=stp->cfp; cfp; cfp=cfp->next){  /* Loop over all configurations */
      if( cfp->rp->nrhs==cfp->dot ){        /* Is dot at extreme right? */
        for(j=0; j<lemp->nterminal; j++){
          if( SetFind(cfp->fws,j) ){
            /* Add a reduce action to the state "stp" which will reduce by the
            ** rule "cfp->rp" if the lookahead symbol is "lemp->symbols[j]" */
            Action_add(&stp->ap,REDUCE,lemp->symbols[j],(char *)cfp->rp);
          }
	}
      }
    }
  }

  /* Add the accepting token */
  if( lemp->start ){
    sp = Symbol_find(lemp->start);
    if( sp==0 ) sp = lemp->rule->lhs;
  }else{
    sp = lemp->rule->lhs;
  }
  /* Add to the first state (which is always the starting state of the
  ** finite state machine) an action to ACCEPT if the lookahead is the
  ** start nonterminal.  */
  Action_add(&lemp->sorted[0]->ap,ACCEPT,sp,0);

  /* Resolve conflicts */
  for(i=0; i<lemp->nstate; i++){
    struct action *ap, *nap;
    struct state *stp;
    stp = lemp->sorted[i];
    /* assert( stp->ap ); */
    stp->ap = Action_sort(stp->ap);
    for(ap=stp->ap; ap && ap->next; ap=ap->next){
      for(nap=ap->next; nap && nap->sp==ap->sp; nap=nap->next){
         /* The two actions "ap" and "nap" have the same lookahead.
         ** Figure out which one should be used */
         lemp->nconflict += resolve_conflict(ap,nap,lemp->errsym);
      }
    }
  }

  /* Report an error for each rule that can never be reduced. */
  for(rp=lemp->rule; rp; rp=rp->next) rp->canReduce = LEMON_FALSE;
  for(i=0; i<lemp->nstate; i++){
    struct action *ap;
    for(ap=lemp->sorted[i]->ap; ap; ap=ap->next){
      if( ap->type==REDUCE ) ap->x.rp->canReduce = LEMON_TRUE;
    }
  }
  for(rp=lemp->rule; rp; rp=rp->next){
    if( rp->canReduce ) continue;
    ErrorMsg(lemp->filename,rp->ruleline,"This rule can not be reduced.\n");
    lemp->errorcnt++;
  }
}